

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void config_free(ConfigScanner *sc)

{
  SectionList *pSVar1;
  ConfigItem *pCVar2;
  ConfigItem *pCVar3;
  SectionList *__ptr;
  ConfigItem *__ptr_00;
  SectionList *__ptr_01;
  
  if (sc == (ConfigScanner *)0x0) {
    return;
  }
  pCVar2 = sc->first_item;
  __ptr_00 = (ConfigItem *)0x0;
  while (pCVar3 = pCVar2, pCVar3 != (ConfigItem *)0x0) {
    if (__ptr_00 != (ConfigItem *)0x0) {
      free(__ptr_00);
    }
    if (pCVar3->key != (char *)0x0) {
      free(pCVar3->key);
    }
    if ((pCVar3->vtype == VTYPE_STRING) && ((pCVar3->value).v_string != (char *)0x0)) {
      free((pCVar3->value).v_string);
    }
    __ptr_00 = pCVar3;
    pCVar2 = pCVar3->succ;
  }
  if (__ptr_00 != (ConfigItem *)0x0) {
    free(__ptr_00);
  }
  if (sc->first_section == (SectionList *)0x0) {
    __ptr_01 = (SectionList *)0x0;
  }
  else {
    pSVar1 = sc->first_section;
    __ptr = (SectionList *)0x0;
    do {
      __ptr_01 = pSVar1;
      if (__ptr != (SectionList *)0x0) {
        free(__ptr);
      }
      if (__ptr_01->name != (char *)0x0) {
        free(__ptr_01->name);
      }
      pSVar1 = __ptr_01->succ;
      __ptr = __ptr_01;
    } while (__ptr_01->succ != (SectionList_t *)0x0);
  }
  if (__ptr_01 != (SectionList *)0x0) {
    free(__ptr_01);
  }
  if (sc->base != (char *)0x0) {
    free(sc->base);
  }
  free(sc);
  return;
}

Assistant:

void config_free(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	ConfigItem *c_item = sc->first_item;
	ConfigItem *c_prev = NULL;
	while (c_item != NULL)
	{
		if (c_prev)
		{
			free(c_prev);
		}
		if (c_item->key)
		{
			free(c_item->key);
		}
		if (c_item->vtype == VTYPE_STRING && c_item->value.v_string)
		{
			free(c_item->value.v_string);
		}
		c_prev = c_item;
		c_item = c_item->succ;
	}
	if (c_prev)
	{
		free(c_prev);
	}

	SectionList *s_item = sc->first_section;
	SectionList *s_prev = NULL;
	while (s_item != NULL)
	{
		if (s_prev)
		{
			free(s_prev);
		}
		if (s_item->name)
		{
			free(s_item->name);
		}
		s_prev = s_item;
		s_item = s_item->succ;
	}
	if (s_prev)
	{
		free(s_prev);
	}

	if (sc != NULL && sc->base != NULL)
	{
		free(sc->base);
	}

	if (sc != NULL)
	{
		free(sc);
	}
}